

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_utils.hpp
# Opt level: O0

bool Args::
     eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
               (Context *context,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *container,String *errorDescription,CmdLine *cmdLine)

{
  bool bVar1;
  undefined8 uVar2;
  string *in_RDX;
  value_type *in_RSI;
  Context *in_RDI;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  last;
  iterator begin;
  Context *in_stack_ffffffffffffff58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff60;
  String *in_stack_ffffffffffffff68;
  value_type *__x;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff74;
  anon_class_8_1_b808ab2e_for__M_pred in_stack_ffffffffffffff78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28 [2];
  string *local_18;
  value_type *local_10;
  Context *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = Context::atEnd((Context *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (!bVar1) {
    local_28[0]._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Context::begin_abi_cxx11_(local_8);
    Context::begin_abi_cxx11_(local_8);
    Context::end_abi_cxx11_(in_stack_ffffffffffffff58);
    std::
    find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Args::eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>(Args::Context&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,Args::CmdLine*)::_lambda(std::__cxx11::string_const&)_1_>
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (bVar1) {
      local_28[0]._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Context::next_abi_cxx11_(in_stack_ffffffffffffff58);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff60,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffff58), bVar1) {
        __x = local_10;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(local_28);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),__x);
        local_28[0]._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Context::next_abi_cxx11_(in_stack_ffffffffffffff58);
      }
      Context::end_abi_cxx11_(in_stack_ffffffffffffff58);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffff60,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffff58);
      if (bVar1) {
        Context::putBack((Context *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      }
      return true;
    }
  }
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff70);
  uVar2 = __cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff80,local_18);
  BaseException::BaseException
            ((BaseException *)CONCAT44(in_stack_ffffffffffffff74,uVar3),in_stack_ffffffffffffff68);
  __cxa_throw(uVar2,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

bool eatValues( Ctx & context, Container & container,
	const String & errorDescription, Cmd * cmdLine )
{
	if( !context.atEnd() )
	{
		auto begin = context.begin();

		auto last = std::find_if( context.begin(), context.end(),
			[ & ] ( const String & v ) -> bool
			{
				return( cmdLine->findArgument( v ) != nullptr );
			}
		);

		if( last != begin )
		{
			begin = context.next();

			while( begin != last )
			{
				container.push_back( *begin );

				begin = context.next();
			}

			if( last != context.end() )
				context.putBack();

			return true;
		}
	}

	throw BaseException( errorDescription );
}